

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

Expression * __thiscall soul::Optimisations::Inliner::cloneExpression(Inliner *this,Expression *old)

{
  Module *pMVar1;
  int iVar2;
  long lVar3;
  Variable *pVVar4;
  Expression *pEVar5;
  Expression *args_2;
  undefined4 extraout_var;
  ArrayElement *old_00;
  StructElement *old_01;
  ProcessorProperty *pPVar6;
  void *in_R8;
  undefined1 auVar7 [16];
  
  lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::Constant::typeinfo);
  if (lVar3 == 0) {
    lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::BinaryOperator::typeinfo);
    if (lVar3 == 0) {
      lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::UnaryOperator::typeinfo);
      if (lVar3 == 0) {
        lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::TypeCast::typeinfo);
        if (lVar3 == 0) {
          iVar2 = 0;
          auVar7 = __dynamic_cast(old,&heart::Expression::typeinfo,
                                  &heart::PureFunctionCall::typeinfo);
          if (auVar7._0_8_ == (__fn *)0x0) {
            pVVar4 = (Variable *)
                     __dynamic_cast(old,&heart::Expression::typeinfo,&heart::Variable::typeinfo,0);
            if (pVVar4 == (Variable *)0x0) {
              old_00 = (ArrayElement *)
                       __dynamic_cast(old,&heart::Expression::typeinfo,
                                      &heart::ArrayElement::typeinfo,0);
              if (old_00 == (ArrayElement *)0x0) {
                old_01 = (StructElement *)
                         __dynamic_cast(old,&heart::Expression::typeinfo,
                                        &heart::StructElement::typeinfo,0);
                if (old_01 == (StructElement *)0x0) {
                  lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,
                                         &heart::ProcessorProperty::typeinfo,0);
                  if (lVar3 == 0) {
                    throwInternalCompilerError("object != nullptr","operator->",0x3c);
                  }
                  pPVar6 = PoolAllocator::
                           allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property_const&>
                                     (&this->module->allocator->pool,(CodeLocation *)(lVar3 + 8),
                                      (Property *)(lVar3 + 0x18));
                  return &pPVar6->super_Expression;
                }
                pVVar4 = (Variable *)cloneStructElement(this,old_01);
              }
              else {
                pVVar4 = (Variable *)cloneArrayElement(this,old_00);
              }
            }
            else {
              pVVar4 = getRemappedVariable(this,pVVar4);
            }
          }
          else {
            iVar2 = clone(this,auVar7._0_8_,auVar7._8_8_,iVar2,in_R8);
            pVVar4 = (Variable *)CONCAT44(extraout_var,iVar2);
          }
        }
        else {
          pMVar1 = this->module;
          pEVar5 = cloneExpression(this,*(Expression **)(lVar3 + 0x18));
          pVVar4 = (Variable *)
                   PoolAllocator::
                   allocate<soul::heart::TypeCast,soul::CodeLocation&,soul::heart::Expression&,soul::Type&>
                             (&pMVar1->allocator->pool,(CodeLocation *)(lVar3 + 8),pEVar5,
                              (Type *)(lVar3 + 0x20));
        }
      }
      else {
        pMVar1 = this->module;
        pEVar5 = cloneExpression(this,*(Expression **)(lVar3 + 0x18));
        pVVar4 = (Variable *)
                 PoolAllocator::
                 allocate<soul::heart::UnaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::UnaryOp::Op&>
                           (&pMVar1->allocator->pool,(CodeLocation *)(lVar3 + 8),pEVar5,
                            (Op *)(lVar3 + 0x20));
      }
    }
    else {
      pMVar1 = this->module;
      pEVar5 = cloneExpression(this,*(Expression **)(lVar3 + 0x18));
      args_2 = cloneExpression(this,*(Expression **)(lVar3 + 0x20));
      pVVar4 = (Variable *)
               PoolAllocator::
               allocate<soul::heart::BinaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                         (&pMVar1->allocator->pool,(CodeLocation *)(lVar3 + 8),pEVar5,args_2,
                          (Op *)(lVar3 + 0x28));
    }
  }
  else {
    pVVar4 = (Variable *)
             PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value&>
                       (&this->module->allocator->pool,(CodeLocation *)(lVar3 + 8),
                        (Value *)(lVar3 + 0x18));
  }
  return &pVVar4->super_Expression;
}

Assistant:

heart::Expression& cloneExpression (heart::Expression& old)
        {
            if (auto c = cast<heart::Constant> (old))
                return module.allocate<heart::Constant> (c->location, c->value);

            if (auto b = cast<heart::BinaryOperator> (old))
                return module.allocate<heart::BinaryOperator> (b->location,
                                                               cloneExpression (b->lhs),
                                                               cloneExpression (b->rhs),
                                                               b->operation);

            if (auto u = cast<heart::UnaryOperator> (old))
                return module.allocate<heart::UnaryOperator> (u->location, cloneExpression (u->source), u->operation);

            if (auto t = cast<heart::TypeCast> (old))
                return module.allocate<heart::TypeCast> (t->location, cloneExpression (t->source), t->destType);

            if (auto f = cast<heart::PureFunctionCall> (old))
                return clone (*f);

            if (auto v = cast<heart::Variable> (old))
                return getRemappedVariable (*v);

            if (auto s = cast<heart::ArrayElement> (old))
                return cloneArrayElement (*s);

            if (auto s = cast<heart::StructElement> (old))
                return cloneStructElement (*s);

            auto pp = cast<heart::ProcessorProperty> (old);
            return module.allocate<heart::ProcessorProperty> (pp->location, pp->property);
        }